

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O1

bool __thiscall
cs_impl::any::
holder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::compare
          (holder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,baseHolder *obj)

{
  char *__s1;
  char *__s2;
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  iVar2 = (*obj->_vptr_baseHolder[2])(obj);
  iVar3 = (*(this->super_baseHolder)._vptr_baseHolder[2])(this);
  __s1 = *(char **)(CONCAT44(extraout_var,iVar2) + 8);
  __s2 = *(char **)(CONCAT44(extraout_var_00,iVar3) + 8);
  if (__s1 != __s2) {
    if (*__s1 != '*') {
      iVar2 = strcmp(__s1,__s2);
      if (iVar2 == 0) goto LAB_002036a1;
    }
    return false;
  }
LAB_002036a1:
  bVar1 = compare_if<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          ::compare(&this->mDat,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(obj + 1));
  return bVar1;
}

Assistant:

bool compare(const baseHolder *obj) const override
			{
				if (obj->type() == this->type())
					return cs_impl::compare(mDat, static_cast<const holder<T> *>(obj)->data());
				else
					return false;
			}